

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

TSTree * ts_tree_new(Subtree root,TSLanguage *language,TSRange *included_ranges,
                    uint included_range_count)

{
  TSInput input;
  Subtree *pSVar1;
  SubtreeHeapData *__dest;
  TSTree *pTVar2;
  uint uVar3;
  TSLanguage *old_tree;
  uint uStack_3c;
  undefined1 auStack_38 [8];
  code *pcStack_30;
  
  pcStack_30 = (code *)0x12f9a6;
  uVar3 = included_range_count;
  old_tree = language;
  pSVar1 = (Subtree *)malloc(0x30);
  if (pSVar1 == (Subtree *)0x0) {
    pcStack_30 = (code *)0x12fa09;
    ts_tree_new_cold_2();
  }
  else {
    *pSVar1 = root;
    pSVar1[1].ptr = (SubtreeHeapData *)language;
    language = (TSLanguage *)(ulong)included_range_count;
    old_tree = (TSLanguage *)&DAT_00000018;
    pcStack_30 = (code *)0x12f9c5;
    __dest = (SubtreeHeapData *)calloc((size_t)language,0x18);
    uVar3 = CONCAT31((int3)(uVar3 >> 8),included_range_count == 0);
    pSVar1[2].ptr = (SubtreeHeapData *)0x0;
    pSVar1[3].ptr = (SubtreeHeapData *)0x0;
    if (__dest != (SubtreeHeapData *)0x0 || included_range_count == 0) {
      pSVar1[4].ptr = __dest;
      pcStack_30 = (code *)0x12f9f3;
      memcpy(__dest,included_ranges,(long)language * 0x18);
      *(uint *)(pSVar1 + 5) = included_range_count;
      return (TSTree *)pSVar1;
    }
  }
  pcStack_30 = ts_parser_parse_string;
  ts_tree_new_cold_1();
  pcStack_30 = (code *)CONCAT44(pcStack_30._4_4_,uVar3);
  input.read = ts_string_input_read;
  input.payload = auStack_38;
  input._16_8_ = (ulong)uStack_3c << 0x20;
  pTVar2 = ts_parser_parse((TSParser *)language,(TSTree *)old_tree,input);
  return pTVar2;
}

Assistant:

TSTree *ts_tree_new(
  Subtree root, const TSLanguage *language,
  const TSRange *included_ranges, unsigned included_range_count
) {
  TSTree *result = ts_malloc(sizeof(TSTree));
  result->root = root;
  result->language = language;
  result->parent_cache = NULL;
  result->parent_cache_start = 0;
  result->parent_cache_size = 0;
  result->included_ranges = ts_calloc(included_range_count, sizeof(TSRange));
  memcpy(result->included_ranges, included_ranges, included_range_count * sizeof(TSRange));
  result->included_range_count = included_range_count;
  return result;
}